

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::MatchLiteralNode::Emit(MatchLiteralNode *this,Compiler *compiler,CharCount *skipped)

{
  bool isEquivClass;
  uint uVar1;
  uint uVar2;
  uint8 *puVar3;
  uint uVar4;
  
  uVar1 = *skipped;
  uVar2 = this->length;
  if (uVar1 < uVar2) {
    isEquivClass = this->isEquivClass;
    uVar4 = (uVar1 << (isEquivClass * '\x02' & 0x1fU)) + this->offset;
    *skipped = 0;
    if (uVar2 - uVar1 == 1) {
      MatchCharNode::Emit(compiler,(compiler->program->rep).insts.litbuf.ptr + uVar4,isEquivClass);
      return;
    }
    puVar3 = Compiler::Emit(compiler,9);
    if (isEquivClass == false) {
      *puVar3 = ' ';
    }
    else {
      *puVar3 = '!';
    }
    *(uint *)(puVar3 + 1) = uVar4;
    *(uint *)(puVar3 + 5) = uVar2 - uVar1;
  }
  else {
    *skipped = uVar1 - uVar2;
  }
  return;
}

Assistant:

void MatchLiteralNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        if (skipped >= length)
        {
            // Asking to skip entire literal
            skipped -= length;
            return;
        }

        //
        // Compilation scheme:
        //
        //   Match(Char|Char4|Literal|LiteralEquiv)Inst
        //

        CharCount effectiveOffset = offset + skipped * (isEquivClass ? CaseInsensitive::EquivClassSize : 1);
        CharCount effectiveLength = length - skipped;
        skipped -= min(skipped, length);

        if (effectiveLength == 1)
        {
            Char* cs = compiler.program->rep.insts.litbuf + effectiveOffset;
            MatchCharNode::Emit(compiler, cs, isEquivClass);
        }
        else
        {
            if (isEquivClass)
                EMIT(compiler, MatchLiteralEquivInst, effectiveOffset, effectiveLength);
            else
                EMIT(compiler, MatchLiteralInst, effectiveOffset, effectiveLength);
        }
    }